

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,(anonymous_namespace)::MyAlloc<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::sorted_policy,(anonymous_namespace)::MyAlloc<char>>::half_storage>
          (basic_json<char,_jsoncons::sorted_policy,_(anonymous_namespace)::MyAlloc<char>_> *this,
          basic_json<char,_jsoncons::sorted_policy,_(anonymous_namespace)::MyAlloc<char>_> *other)

{
  json_storage_kind jVar1;
  basic_json<char,_jsoncons::sorted_policy,_(anonymous_namespace)::MyAlloc<char>_> *in_RSI;
  
  jVar1 = basic_json<char,_jsoncons::sorted_policy,_(anonymous_namespace)::MyAlloc<char>_>::
          storage_kind(in_RSI);
  (*(code *)(&DAT_00fd309c + *(int *)(&DAT_00fd309c + (ulong)jVar1 * 4)))();
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }